

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::TIMESTAMP
                  (Value *__return_storage_ptr__,int32_t year,int32_t month,int32_t day,int32_t hour
                  ,int32_t min,int32_t sec,int32_t micros)

{
  date_t date;
  LogicalType local_40;
  
  date = Date::FromDate(year,month,day);
  TIMESTAMP(__return_storage_ptr__,date,
            (dtime_t)((((long)min + (long)hour * 0x3c) * 0x3c + (long)sec) * 1000000 + (long)micros)
           );
  LogicalType::LogicalType(&local_40,TIMESTAMP);
  LogicalType::operator=(&__return_storage_ptr__->type_,&local_40);
  LogicalType::~LogicalType(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Value Value::TIMESTAMP(int32_t year, int32_t month, int32_t day, int32_t hour, int32_t min, int32_t sec,
                       int32_t micros) {
	auto date = Date::FromDate(year, month, day);
	auto time = Time::FromTime(hour, min, sec, micros);
	auto val = Value::TIMESTAMP(date, time);
	val.type_ = LogicalType::TIMESTAMP;
	return val;
}